

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

float rsg::VariableRead::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  VariableManager *pVVar1;
  bool bVar2;
  pointer ppVVar3;
  float fVar4;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  IsReadableIntersectingEntry local_38;
  
  if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
    pVVar1 = state->m_varManager;
    bVar2 = VariableManager::hasEntry<rsg::(anonymous_namespace)::IsReadableEntry>
                      (pVVar1,(IsReadableEntry)
                              (state->m_exprFlagStack).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1]);
    fVar4 = 0.05;
    if ((!bVar2) &&
       (state->m_shaderParams->maxCombinedVariableScalars <= pVVar1->m_numAllocatedScalars)) {
LAB_015e5656:
      fVar4 = 0.0;
    }
  }
  else {
    bVar2 = rsg::anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
    fVar4 = 1.0;
    if (!bVar2) {
      pVVar1 = state->m_varManager;
      local_38.super_IsReadableEntry.m_exprFlags =
           (state->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1];
      local_50 = valueRange.m_type._0_4_;
      uStack_4c = valueRange.m_type._4_4_;
      uStack_48 = valueRange.m_min._0_4_;
      local_38.m_valueRange.m_min._4_4_ = valueRange.m_min._4_4_;
      local_38.m_valueRange.m_max = valueRange.m_max;
      local_38.m_valueRange.m_type._0_4_ = local_50;
      local_38._4_4_ = uStack_54;
      local_38.m_valueRange.m_type._4_4_ = uStack_4c;
      local_38.m_valueRange.m_min._0_4_ = uStack_48;
      ppVVar3 = (pVVar1->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (ppVVar3 ==
            (pVVar1->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_015e5656;
        bVar2 = rsg::anon_unknown_0::IsReadableIntersectingEntry::operator()(&local_38,*ppVVar3);
        ppVVar3 = ppVVar3 + 1;
      } while (!bVar2);
      fVar4 = 1.0;
    }
  }
  return fVar4;
}

Assistant:

float VariableRead::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid())
	{
		if (state.getVariableManager().hasEntry(IsReadableEntry(state.getExpressionFlags())) ||
			state.getVariableManager().getNumAllocatedScalars() < state.getShaderParameters().maxCombinedVariableScalars)
			return unusedValueWeight;
		else
			return 0.0f;
	}

	if (!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsReadableIntersectingEntry(valueRange, state.getExpressionFlags())))
		return 0.0f;
	else
		return 1.0f;
}